

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::cpp::CppGenerator::Generate
          (CppGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool bVar1;
  int iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *pAVar6;
  ulong uVar7;
  FileGenerator *this_00;
  long lVar8;
  ulong uVar9;
  allocator local_3fa;
  allocator local_3f9;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string local_3d0;
  string info_path;
  string basename;
  undefined1 local_358 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined4 local_338;
  undefined2 local_334;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  Printer printer;
  GeneratedCodeInfo annotations;
  FileGenerator file_generator;
  ZeroCopyOutputStream *pZVar4;
  undefined4 extraout_var_00;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&options);
  local_358._0_8_ = &local_348;
  local_358._8_8_ = 0;
  lVar8 = 0;
  local_348._M_local_buf[0] = '\0';
  local_338._0_1_ = false;
  local_338._1_1_ = false;
  local_338._2_1_ = true;
  local_338._3_1_ = false;
  local_334._0_1_ = false;
  local_334._1_1_ = false;
  local_330._M_allocated_capacity = (size_type)&local_320;
  local_330._8_8_ = 0;
  local_320._M_local_buf[0] = '\0';
  local_310._M_allocated_capacity = (size_type)&local_300;
  local_310._8_8_ = 0;
  local_300._M_local_buf[0] = '\0';
  uVar9 = 0;
LAB_002462b0:
  uVar7 = (long)options.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)options.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  if (uVar7 <= uVar9) {
    StripProto(&basename,*(string **)file);
    FileGenerator::FileGenerator(&file_generator,file,(Options *)local_358);
    if (local_338._1_1_ == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     &basename,".proto.h");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
      pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
      std::__cxx11::string::~string((string *)&printer);
      GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
      annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
           (_func_int **)&PTR_AddAnnotation_00424d88;
      annotation_collector.annotation_proto_ = &annotations;
      std::operator+(&info_path,&basename,".proto.h.meta");
      pAVar6 = &annotation_collector;
      if (local_338._3_1_ == false) {
        pAVar6 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
      }
      io::Printer::Printer(&printer,pZVar4,'$',&pAVar6->super_AnnotationCollector);
      if (local_338._3_1_ == true) {
        std::__cxx11::string::string((string *)&local_3d0,(string *)&info_path);
      }
      else {
        std::__cxx11::string::string((string *)&local_3d0,"",&local_3f9);
      }
      FileGenerator::GenerateProtoHeader(&file_generator,&printer,&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      if (local_338._3_1_ == true) {
        iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&info_path);
        pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2);
        MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,pZVar5);
        if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
        }
      }
      io::Printer::~Printer(&printer);
      std::__cxx11::string::~string((string *)&info_path);
      GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
      if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar4->_vptr_ZeroCopyOutputStream[1])(pZVar4);
      }
    }
    std::__cxx11::string::append((char *)&basename);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                   &basename,".h");
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
    pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar2);
    std::__cxx11::string::~string((string *)&printer);
    GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
    annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
         (_func_int **)&PTR_AddAnnotation_00424d88;
    annotation_collector.annotation_proto_ = &annotations;
    std::operator+(&info_path,&basename,".h.meta");
    pAVar6 = &annotation_collector;
    if (local_338._3_1_ == false) {
      pAVar6 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
    }
    io::Printer::Printer(&printer,pZVar4,'$',&pAVar6->super_AnnotationCollector);
    if (local_338._3_1_ == true) {
      std::__cxx11::string::string((string *)&local_3d0,(string *)&info_path);
    }
    else {
      std::__cxx11::string::string((string *)&local_3d0,"",&local_3fa);
    }
    FileGenerator::GeneratePBHeader(&file_generator,&printer,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    if (local_338._3_1_ == true) {
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&info_path);
      pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar2);
      MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,pZVar5);
      if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
      }
    }
    io::Printer::~Printer(&printer);
    std::__cxx11::string::~string((string *)&info_path);
    GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
    if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar4->_vptr_ZeroCopyOutputStream[1])(pZVar4);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                   &basename,".cc");
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
    pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar2);
    std::__cxx11::string::~string((string *)&printer);
    io::Printer::Printer(&printer,pZVar4,'$');
    FileGenerator::GenerateSource(&file_generator,&printer);
    io::Printer::~Printer(&printer);
    if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar4->_vptr_ZeroCopyOutputStream[1])(pZVar4);
    }
    FileGenerator::~FileGenerator(&file_generator);
    this_00 = (FileGenerator *)&basename;
LAB_00246770:
    std::__cxx11::string::~string((string *)this_00);
    Options::~Options((Options *)local_358);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&options);
    return uVar7 <= uVar9;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&((options.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                  _M_p + lVar8),"dllexport_decl");
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_358;
  if (bVar1) goto LAB_002462e1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&((options.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                  _M_p + lVar8),"safe_boundary_check");
  if (bVar1) {
    local_338._0_1_ = true;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((options.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus
                                    ._M_p + lVar8),"annotate_headers");
    if (bVar1) {
      local_338._3_1_ = true;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&((options.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).
                                      _M_dataplus._M_p + lVar8),"annotation_pragma_name");
      if (bVar1) {
        paVar3 = &local_330;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((options.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus._M_p + lVar8),"annotation_guard_name");
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&((options.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             _M_dataplus._M_p + lVar8),"lite");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&((options.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first).
                                               _M_dataplus._M_p + lVar8),"table_driven_parsing");
            if (bVar1) {
              local_334._1_1_ = true;
              goto LAB_0024632c;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &file_generator,"Unknown generator option: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((options.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + lVar8));
            this_00 = &file_generator;
            std::__cxx11::string::operator=((string *)error,(string *)this_00);
            goto LAB_00246770;
          }
          local_334._0_1_ = true;
          goto LAB_0024632c;
        }
        paVar3 = &local_310;
      }
LAB_002462e1:
      std::__cxx11::string::_M_assign((string *)paVar3->_M_local_buf);
    }
  }
LAB_0024632c:
  uVar9 = uVar9 + 1;
  lVar8 = lVar8 + 0x40;
  goto LAB_002462b0;
}

Assistant:

bool CppGenerator::Generate(const FileDescriptor* file,
                            const string& parameter,
                            GeneratorContext* generator_context,
                            string* error) const {
  std::vector<std::pair<string, string> > options;
  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // TODO(kenton):  If we ever have more options, we may want to create a
  //   class that encapsulates them which we can pass down to all the
  //   generator classes.  Currently we pass dllexport_decl down to all of
  //   them via the constructors, but we don't want to have to add another
  //   constructor parameter for every option.

  // If the dllexport_decl option is passed to the compiler, we need to write
  // it in front of every symbol that should be exported if this .proto is
  // compiled into a Windows DLL.  E.g., if the user invokes the protocol
  // compiler as:
  //   protoc --cpp_out=dllexport_decl=FOO_EXPORT:outdir foo.proto
  // then we'll define classes like this:
  //   class FOO_EXPORT Foo {
  //     ...
  //   }
  // FOO_EXPORT is a macro which should expand to __declspec(dllexport) or
  // __declspec(dllimport) depending on what is being compiled.
  //
  Options file_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "dllexport_decl") {
      file_options.dllexport_decl = options[i].second;
    } else if (options[i].first == "safe_boundary_check") {
      file_options.safe_boundary_check = true;
    } else if (options[i].first == "annotate_headers") {
      file_options.annotate_headers = true;
    } else if (options[i].first == "annotation_pragma_name") {
      file_options.annotation_pragma_name = options[i].second;
    } else if (options[i].first == "annotation_guard_name") {
      file_options.annotation_guard_name = options[i].second;
    } else if (options[i].first == "lite") {
      file_options.enforce_lite = true;
    } else if (options[i].first == "table_driven_parsing") {
      file_options.table_driven_parsing = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // -----------------------------------------------------------------


  string basename = StripProto(file->name());

  FileGenerator file_generator(file, file_options);

  // Generate header(s).
  if (file_options.proto_h) {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".proto.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    string info_path = basename + ".proto.h.meta";
    io::Printer printer(output.get(), '$', file_options.annotate_headers
                                               ? &annotation_collector
                                               : NULL);
    file_generator.GenerateProtoHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  basename.append(".pb");
  {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    string info_path = basename + ".h.meta";
    io::Printer printer(output.get(), '$', file_options.annotate_headers
                                               ? &annotation_collector
                                               : NULL);
    file_generator.GeneratePBHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  // Generate cc file.
  {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".cc"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateSource(&printer);
  }

  return true;
}